

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Locker.cpp
# Opt level: O0

void Handlers::Locker_Open(Character *character,PacketReader *reader)

{
  Character_Item CVar1;
  bool bVar2;
  int iVar3;
  TileSpec TVar4;
  size_type sVar5;
  reference pCVar6;
  unsigned_short local_80;
  uint uStack_7c;
  Character_Item item;
  iterator __end3;
  iterator __begin3;
  list<Character_Item,_std::allocator<Character_Item>_> *__range3;
  undefined1 local_50 [8];
  PacketBuilder reply;
  uchar y;
  uchar x;
  PacketReader *reader_local;
  Character *character_local;
  
  reply.add_size._7_1_ = PacketReader::GetChar(reader);
  reply.add_size._6_1_ = PacketReader::GetChar(reader);
  iVar3 = util::path_length((uint)character->x,(uint)character->y,(uint)reply.add_size._7_1_,
                            (uint)reply.add_size._6_1_);
  if ((iVar3 < 2) &&
     (TVar4 = Map::GetSpec(character->map,reply.add_size._7_1_,reply.add_size._6_1_),
     TVar4 == BankVault)) {
    sVar5 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                      (&character->bank);
    PacketBuilder::PacketBuilder((PacketBuilder *)local_50,PACKET_LOCKER,PACKET_OPEN,sVar5 * 5 + 2);
    PacketBuilder::AddChar((PacketBuilder *)local_50,reply.add_size._7_1_);
    PacketBuilder::AddChar((PacketBuilder *)local_50,reply.add_size._6_1_);
    __end3 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin
                       (&character->bank);
    item = (Character_Item)
           std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end
                     (&character->bank);
    while (bVar2 = std::operator!=(&__end3,(_Self *)&item), bVar2) {
      pCVar6 = std::_List_iterator<Character_Item>::operator*(&__end3);
      CVar1 = *pCVar6;
      local_80 = CVar1.id;
      PacketBuilder::AddShort((PacketBuilder *)local_50,local_80);
      uStack_7c = CVar1.amount;
      PacketBuilder::AddThree((PacketBuilder *)local_50,uStack_7c);
      std::_List_iterator<Character_Item>::operator++(&__end3);
    }
    Character::Send(character,(PacketBuilder *)local_50);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_50);
  }
  return;
}

Assistant:

void Locker_Open(Character *character, PacketReader &reader)
{
	unsigned char x = reader.GetChar();
	unsigned char y = reader.GetChar();

	if (util::path_length(character->x, character->y, x, y) <= 1)
	{
		if (character->map->GetSpec(x, y) == Map_Tile::BankVault)
		{
			PacketBuilder reply(PACKET_LOCKER, PACKET_OPEN, 2 + character->bank.size() * 5);
			reply.AddChar(x);
			reply.AddChar(y);
			UTIL_FOREACH(character->bank, item)
			{
				reply.AddShort(item.id);
				reply.AddThree(item.amount);
			}
			character->Send(reply);
		}
	}
}